

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O3

void __thiscall kj::CidrRange::CidrRange(CidrRange *this,StringPtr pattern)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  StringPtr *pSVar4;
  size_t sVar5;
  ulong elementCount;
  size_t __n;
  char *__s;
  int __af;
  char *ptrCopy;
  StringPtr *__cp;
  byte *__buf;
  Fault f;
  StringPtr pattern_local;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  undefined8 *local_e0;
  Array<char> addr_heap;
  char addr_stack [128];
  
  sVar5 = pattern.content.size_;
  __s = pattern.content.ptr;
  pattern_local.content.ptr = __s;
  pattern_local.content.size_ = sVar5;
  pvVar3 = memchr(__s,0x2f,sVar5 - 1);
  if (pvVar3 == (void *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
              ((Fault *)addr_stack,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
               ,0x33,FAILED,"pattern.findFirst(\'/\') != nullptr","\"invalid CIDR\", pattern",
               (char (*) [13])"invalid CIDR",&pattern_local);
    kj::_::Debug::Fault::fatal((Fault *)addr_stack);
  }
  __n = (long)pvVar3 - (long)__s;
  elementCount = __n + 1;
  addr_stack._0_8_ = (long)pvVar3 + 1;
  addr_stack._8_8_ = sVar5 - elementCount;
  uVar2 = StringPtr::parseAs<unsigned_int>((StringPtr *)addr_stack);
  this->bitCount = uVar2;
  if (elementCount < 0x81) {
    local_e0 = (undefined8 *)0x0;
    elementCount = 0;
    pSVar4 = (StringPtr *)0x0;
    __cp = (StringPtr *)addr_stack;
  }
  else {
    pSVar4 = (StringPtr *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    local_e0 = &kj::_::HeapArrayDisposer::instance;
    __cp = pSVar4;
  }
  puVar1 = &this->bitCount;
  memcpy(__cp,pattern_local.content.ptr,__n);
  *(undefined1 *)((long)__cp + __n) = 0;
  pvVar3 = memchr(pattern_local.content.ptr,0x3a,pattern_local.content.size_ - 1);
  _kjCondition.left = puVar1;
  if (pvVar3 == (void *)0x0) {
    this->family = 2;
    _kjCondition.result = this->bitCount < 0x21;
    _kjCondition.right = 0x20;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[13],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x3d,FAILED,"bitCount <= 32","_kjCondition,\"invalid CIDR\", pattern",
                 &_kjCondition,(char (*) [13])"invalid CIDR",&pattern_local);
      kj::_::Debug::Fault::fatal(&f);
    }
    __af = 2;
  }
  else {
    this->family = 10;
    _kjCondition.result = this->bitCount < 0x81;
    _kjCondition.right = 0x80;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[13],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x40,FAILED,"bitCount <= 128","_kjCondition,\"invalid CIDR\", pattern",
                 &_kjCondition,(char (*) [13])"invalid CIDR",&pattern_local);
      kj::_::Debug::Fault::fatal(&f);
    }
    __af = 10;
  }
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " <= ";
  __buf = this->bits;
  uVar2 = inet_pton(__af,(char *)__cp,__buf);
  _kjCondition.left = (uint *)(ulong)uVar2;
  _kjCondition._8_8_ = anon_var_dwarf_2132c4;
  _kjCondition.op.content.ptr = &DAT_00000004;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,0 < (int)uVar2);
  if (0 < (int)uVar2) {
    uVar2 = *puVar1;
    if (uVar2 < 0x80) {
      __buf[uVar2 >> 3] = __buf[uVar2 >> 3] & (byte)(0xff00 >> ((byte)uVar2 & 7));
      memset(__buf + (ulong)(*puVar1 >> 3) + 1,0,0xf - (ulong)(*puVar1 >> 3));
    }
    if (pSVar4 != (StringPtr *)0x0) {
      (**(code **)*local_e0)(local_e0,pSVar4,1,elementCount,elementCount,0);
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&,char_const(&)[13],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
             ,0x43,FAILED,"inet_pton(family, addr.begin(), bits) > 0",
             "_kjCondition,\"invalid CIDR\", pattern",(DebugComparison<int,_int> *)&_kjCondition,
             (char (*) [13])"invalid CIDR",&pattern_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

CidrRange::CidrRange(StringPtr pattern) {
  size_t slashPos = KJ_REQUIRE_NONNULL(pattern.findFirst('/'), "invalid CIDR", pattern);

  bitCount = pattern.slice(slashPos + 1).parseAs<uint>();

  KJ_STACK_ARRAY(char, addr, slashPos + 1, 128, 128);
  memcpy(addr.begin(), pattern.begin(), slashPos);
  addr[slashPos] = '\0';

  if (pattern.findFirst(':') == kj::none) {
    family = AF_INET;
    KJ_REQUIRE(bitCount <= 32, "invalid CIDR", pattern);
  } else {
    family = AF_INET6;
    KJ_REQUIRE(bitCount <= 128, "invalid CIDR", pattern);
  }

  KJ_ASSERT(inet_pton(family, addr.begin(), bits) > 0, "invalid CIDR", pattern);
  zeroIrrelevantBits();
}